

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UBool __thiscall
icu_63::CollationFastLatinBuilder::encodeUniqueCEs
          (CollationFastLatinBuilder *this,UErrorCode *errorCode)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint16_t *puVar6;
  uint uVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  int iVar5;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  uprv_free_63(this->miniCEs);
  puVar6 = (uint16_t *)uprv_malloc_63((long)(this->uniqueCEs).count * 2);
  this->miniCEs = puVar6;
  if (puVar6 == (uint16_t *)0x0) {
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
    bVar2 = false;
  }
  else {
    if (0 < (this->uniqueCEs).count) {
      uVar3 = this->lastSpecialPrimaries[0];
      lVar15 = 0;
      iVar4 = 0;
      uVar16 = 0;
      uVar12 = 0;
      uVar13 = 0;
      uVar7 = 0;
      uVar10 = 0;
      do {
        uVar1 = (this->uniqueCEs).elements[lVar15];
        uVar14 = (uint)(uVar1 >> 0x20);
        uVar11 = (uint)uVar12;
        if (uVar16 == uVar14) {
LAB_00239141:
          uVar12 = uVar1 >> 0x10 & 0xffff;
          if ((uint)uVar12 == uVar11) {
            uVar12 = (ulong)uVar11;
            uVar8 = uVar7;
            uVar14 = uVar13;
          }
          else {
            uVar14 = 0;
            if (uVar10 == 0) {
              if (uVar7 != 0) {
                if (uVar7 < 0x3e0) goto LAB_0023924c;
LAB_00239329:
                uVar9 = 1;
                uVar12 = (ulong)uVar11;
                goto LAB_00239334;
              }
              uVar8 = 0x180;
            }
            else if ((uint)uVar1 < 0x5000000) {
              if (uVar7 == 0xa0) {
                uVar8 = 0;
                uVar14 = 0;
              }
              else {
                if (0x7f < uVar7) goto LAB_00239329;
LAB_0023924c:
                uVar8 = uVar7 + 0x20;
              }
            }
            else {
              uVar8 = 0xa0;
              if (((uint)uVar12 != 0x500) && (uVar8 = 0xc0, 0xbf < uVar7)) {
                if (uVar7 < 0x160) goto LAB_0023924c;
                goto LAB_00239329;
              }
            }
          }
          uVar7 = uVar8;
          if (0x500 < ((uint)uVar1 & 0x3f3f)) {
            uVar9 = 1;
            uVar13 = uVar14;
            if (6 < uVar14) goto LAB_00239334;
            uVar14 = uVar14 + 1;
          }
          uVar13 = uVar14;
          if (uVar10 - 0xc00 < 0x3f9) {
            uVar9 = (ushort)uVar14 | (ushort)uVar10;
          }
          else {
            uVar9 = (ushort)uVar8 | (ushort)uVar10 | (ushort)uVar14;
          }
        }
        else {
          if (uVar3 < uVar14) {
            lVar17 = (long)iVar4;
            iVar5 = 3;
            if (3 < iVar4) {
              iVar5 = iVar4;
            }
            iVar4 = iVar5 + 1;
            do {
              UnicodeString::setCharAt(&this->result,(int)lVar17 + 1,(UChar)uVar10);
              if (2 < lVar17) {
                uVar3 = 0xffffffff;
                goto LAB_002392ac;
              }
              uVar3 = this->lastSpecialPrimaries[lVar17 + 1];
              lVar17 = lVar17 + 1;
            } while (uVar3 < uVar14);
            iVar4 = (int)lVar17;
          }
LAB_002392ac:
          if (this->firstShortPrimary <= uVar14) {
            uVar11 = 0x500;
            if (uVar10 < 0x1000) {
              uVar10 = 0x1000;
              uVar7 = 0xa0;
              uVar16 = uVar14;
              uVar13 = 0;
            }
            else {
              if (0xf7ff < uVar10) {
                this->shortPrimaryOverflow = '\x01';
                uVar9 = 1;
                goto LAB_00239334;
              }
              uVar10 = uVar10 + 0x400;
              uVar7 = 0xa0;
              uVar16 = uVar14;
              uVar13 = 0;
            }
            goto LAB_00239141;
          }
          uVar11 = 0x500;
          if (uVar10 == 0) {
            uVar10 = 0xc00;
            uVar7 = 0xa0;
            uVar16 = uVar14;
            uVar13 = 0;
            goto LAB_00239141;
          }
          uVar9 = 1;
          if (uVar10 < 0xff8) {
            uVar10 = uVar10 + 8;
            uVar7 = 0xa0;
            uVar16 = uVar14;
            uVar13 = 0;
            goto LAB_00239141;
          }
        }
LAB_00239334:
        this->miniCEs[lVar15] = uVar9;
        lVar15 = lVar15 + 1;
      } while (lVar15 < (this->uniqueCEs).count);
    }
    bVar2 = *errorCode < U_ILLEGAL_ARGUMENT_ERROR;
  }
  return bVar2;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }